

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void array_bitset_ixor_test(void)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  _Bool _Var4;
  array_container_t *container;
  array_container_t *dst;
  array_container_t *dst_00;
  array_container_t *container_00;
  array_container_t *container_01;
  bitset_container_t *source;
  bitset_container_t *dest;
  bitset_container_t *dest_00;
  bitset_container_t *src_1;
  bitset_container_t *bitset;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  int x;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong unaff_R14;
  bool bVar12;
  container_t *C;
  array_container_t *local_38;
  
  container = array_container_create();
  dst = array_container_create();
  dst_00 = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  source = bitset_container_create();
  dest = bitset_container_create();
  dest_00 = bitset_container_create();
  src_1 = bitset_container_create();
  uVar11 = 0;
  bitset = bitset_container_create();
  do {
    iVar2 = container->cardinality;
    uVar7 = (ushort)uVar11;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container->array[(long)iVar2 + -1] < uVar7)))) {
      if (iVar2 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      iVar2 = container->cardinality;
      container->cardinality = iVar2 + 1;
      container->array[iVar2] = uVar7;
    }
    else {
      iVar5 = iVar2 + -1;
      uVar8 = 0;
      uVar6 = unaff_R14;
      do {
        if (iVar5 < (int)uVar8) {
          unaff_R14 = (ulong)~uVar8;
          break;
        }
        uVar10 = uVar8 + iVar5 >> 1;
        unaff_R14 = (ulong)uVar10;
        uVar1 = *(ushort *)((long)container->array + (ulong)(uVar8 + iVar5 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar8 = uVar10 + 1;
          bVar12 = true;
          unaff_R14 = uVar6;
        }
        else if (uVar7 < uVar1) {
          iVar5 = uVar10 - 1;
          bVar12 = true;
          unaff_R14 = uVar6;
        }
        else {
          bVar12 = false;
        }
        uVar6 = unaff_R14;
      } while (bVar12);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)unaff_R14 < 0)) {
        if (iVar2 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar8 = ~(uint)unaff_R14;
        unaff_R14 = (ulong)uVar8;
        memmove(container->array + unaff_R14 + 1,container->array + unaff_R14,
                (long)(int)(iVar2 - uVar8) * 2);
        container->array[unaff_R14] = uVar7;
        container->cardinality = container->cardinality + 1;
      }
    }
    uVar8 = (uint)uVar11;
    uVar6 = source->words[uVar11 >> 6];
    uVar9 = uVar6 | 1L << (uVar11 & 0x3f);
    source->cardinality = source->cardinality + (int)((uVar6 ^ uVar9) >> ((byte)uVar11 & 0x3f));
    source->words[uVar11 >> 6] = uVar9;
    uVar11 = (ulong)(uVar8 + 3);
  } while (uVar8 < 0xfffd);
  uVar8 = 0;
  do {
    iVar2 = container_00->cardinality;
    uVar11 = (ulong)iVar2;
    uVar7 = (ushort)uVar8;
    if ((uVar11 == 0) || ((iVar2 != 0x7fffffff && (container_00->array[uVar11 - 1] < uVar7)))) {
      if (iVar2 == container_00->capacity) {
        array_container_grow(container_00,container_00->capacity + 1,true);
      }
      iVar2 = container_00->cardinality;
      container_00->cardinality = iVar2 + 1;
      container_00->array[iVar2] = uVar7;
    }
    else {
      iVar5 = iVar2 + -1;
      uVar10 = 0;
      uVar6 = unaff_R14;
      do {
        if (iVar5 < (int)uVar10) {
          unaff_R14 = (ulong)~uVar10;
          break;
        }
        uVar3 = uVar10 + iVar5 >> 1;
        unaff_R14 = (ulong)uVar3;
        uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar10 + iVar5 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar10 = uVar3 + 1;
          bVar12 = true;
          unaff_R14 = uVar6;
        }
        else if (uVar7 < uVar1) {
          iVar5 = uVar3 - 1;
          bVar12 = true;
          unaff_R14 = uVar6;
        }
        else {
          bVar12 = false;
        }
        uVar6 = unaff_R14;
      } while (bVar12);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)unaff_R14 < 0)) {
        if (iVar2 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        uVar10 = ~(uint)unaff_R14;
        unaff_R14 = (ulong)uVar10;
        uVar10 = iVar2 - uVar10;
        uVar11 = (ulong)uVar10;
        memmove(container_00->array + unaff_R14 + 1,container_00->array + unaff_R14,
                (long)(int)uVar10 * 2);
        container_00->array[unaff_R14] = uVar7;
        container_00->cardinality = container_00->cardinality + 1;
      }
    }
    uVar6 = src_1->words[uVar8 >> 6];
    uVar9 = uVar6 | 1L << ((ulong)uVar8 & 0x3e);
    src_1->cardinality = src_1->cardinality + (int)((uVar6 ^ uVar9) >> ((byte)uVar8 & 0x3e));
    src_1->words[uVar8 >> 6] = uVar9;
    bVar12 = uVar8 < 0xffc2;
    uVar8 = uVar8 + 0x3e;
  } while (bVar12);
  uVar8 = 0;
  do {
    if ((uVar8 * -0x42108421 >> 1 | (uint)((uVar8 * -0x42108421 & 1) != 0) << 0x1f) < 0x4210843 !=
        uVar8 * -0x55555555 < 0x55555556) {
      iVar2 = container_01->cardinality;
      uVar11 = (ulong)iVar2;
      uVar7 = (ushort)uVar8;
      if ((uVar11 == 0) || ((iVar2 != 0x7fffffff && (container_01->array[uVar11 - 1] < uVar7)))) {
        if (iVar2 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        iVar2 = container_01->cardinality;
        container_01->cardinality = iVar2 + 1;
        container_01->array[iVar2] = uVar7;
      }
      else {
        iVar5 = iVar2 + -1;
        uVar10 = 0;
        uVar6 = unaff_R14;
        do {
          if (iVar5 < (int)uVar10) {
            unaff_R14 = (ulong)~uVar10;
            break;
          }
          uVar3 = uVar10 + iVar5 >> 1;
          unaff_R14 = (ulong)uVar3;
          uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar10 + iVar5 & 0xfffffffe));
          if (uVar1 < uVar7) {
            uVar10 = uVar3 + 1;
            bVar12 = true;
            unaff_R14 = uVar6;
          }
          else if (uVar7 < uVar1) {
            iVar5 = uVar3 - 1;
            bVar12 = true;
            unaff_R14 = uVar6;
          }
          else {
            bVar12 = false;
          }
          uVar6 = unaff_R14;
        } while (bVar12);
        if ((iVar2 != 0x7fffffff) && ((int)(uint)unaff_R14 < 0)) {
          if (iVar2 == container_01->capacity) {
            array_container_grow(container_01,container_01->capacity + 1,true);
          }
          uVar10 = ~(uint)unaff_R14;
          unaff_R14 = (ulong)uVar10;
          uVar10 = iVar2 - uVar10;
          uVar11 = (ulong)uVar10;
          memmove(container_01->array + unaff_R14 + 1,container_01->array + unaff_R14,
                  (long)(int)uVar10 * 2);
          container_01->array[unaff_R14] = uVar7;
          container_01->cardinality = container_01->cardinality + 1;
        }
      }
      uVar6 = bitset->words[uVar8 >> 6];
      uVar9 = uVar6 | 1L << ((ulong)uVar8 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar6 ^ uVar9) >> ((byte)uVar8 & 0x3f));
      bitset->words[uVar8 >> 6] = uVar9;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x10000);
  array_container_copy(container,dst);
  bitset_container_copy(source,dest);
  array_container_copy(container,dst_00);
  iVar2 = dst_00->cardinality;
  if (((long)iVar2 == 0) || ((iVar2 != 0x7fffffff && (dst_00->array[(long)iVar2 + -1] < 2)))) {
    if (iVar2 == dst_00->capacity) {
      array_container_grow(dst_00,dst_00->capacity + 1,true);
    }
    iVar2 = dst_00->cardinality;
    dst_00->cardinality = iVar2 + 1;
    dst_00->array[iVar2] = 2;
  }
  else {
    iVar5 = iVar2 + -1;
    uVar8 = 0;
    do {
      if (iVar5 < (int)uVar8) {
        uVar10 = ~uVar8;
        break;
      }
      uVar10 = uVar8 + iVar5 >> 1;
      uVar7 = *(ushort *)((long)dst_00->array + (ulong)(uVar8 + iVar5 & 0xfffffffe));
      if (uVar7 < 2) {
        uVar8 = uVar10 + 1;
        bVar12 = true;
      }
      else if (uVar7 == 2) {
        bVar12 = false;
        uVar11 = (ulong)uVar10;
      }
      else {
        iVar5 = uVar10 - 1;
        bVar12 = true;
      }
      uVar10 = (uint)uVar11;
    } while (bVar12);
    if ((iVar2 != 0x7fffffff) && ((int)uVar10 < 0)) {
      if (iVar2 == dst_00->capacity) {
        array_container_grow(dst_00,dst_00->capacity + 1,true);
      }
      uVar10 = ~uVar10;
      memmove(dst_00->array + (ulong)uVar10 + 1,dst_00->array + uVar10,
              (long)(int)(iVar2 - uVar10) * 2);
      dst_00->array[uVar10] = 2;
      dst_00->cardinality = dst_00->cardinality + 1;
    }
  }
  bitset_container_copy(source,dest_00);
  uVar11 = *dest_00->words;
  uVar6 = uVar11 | 4;
  dest_00->cardinality = dest_00->cardinality + (int)((uVar11 ^ uVar6) >> 2);
  *dest_00->words = uVar6;
  iVar2 = container_01->cardinality;
  local_38 = (array_container_t *)0x0;
  _Var4 = bitset_array_container_ixor(src_1,container,&local_38);
  _assert_true((ulong)_Var4,"bitset_array_container_ixor(B2, A1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x16d);
  _assert_int_equal((long)iVar2,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x16e);
  _assert_int_equal((unsigned_long)local_38,(unsigned_long)src_1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x170);
  local_38 = (array_container_t *)0x0;
  _Var4 = array_bitset_container_ixor(container_00,source,&local_38);
  _assert_true((ulong)_Var4,"array_bitset_container_ixor(A2, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x173);
  _assert_int_equal((long)iVar2,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x174);
  _assert_int_not_equal
            ((unsigned_long)local_38,(unsigned_long)container_00,
             "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
             ,0x175);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  _Var4 = array_bitset_container_ixor(container,source,&local_38);
  _assert_true((ulong)!_Var4,"array_bitset_container_ixor(A1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x17c);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x17d);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var4 = bitset_bitset_container_ixor(dest_00,dest,&local_38);
  _assert_true((ulong)!_Var4,"bitset_bitset_container_ixor(B1mod, B1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x183);
  _assert_int_equal(1,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x184);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var4 = array_array_container_ixor(dst_00,dst,&local_38);
  _assert_true((ulong)!_Var4,"array_array_container_ixor(A1mod, A1copy, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x188);
  _assert_int_equal(1,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x189);
  array_container_free(container_01);
  array_container_free(dst);
  bitset_container_free(source);
  bitset_container_free(dest);
  bitset_container_free(src_1);
  bitset_container_free(bitset);
  array_container_free(local_38);
  return;
}

Assistant:

DEFINE_TEST(array_bitset_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A1copy = array_container_create();
    array_container_t* A1mod = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B1copy = bitset_container_create();
    bitset_container_t* B1mod = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x += 3) {
        array_container_add(A1, x);
        bitset_container_set(B1, x);
    }

    // important: 62 is not divisible by 3
    for (int x = 0; x < (1 << 16); x += 62) {
        array_container_add(A2, x);
        bitset_container_set(B2, x);
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 == 0) ^ (x % 3 == 0)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    array_container_copy(A1, A1copy);
    bitset_container_copy(B1, B1copy);
    array_container_copy(A1, A1mod);
    array_container_add(A1mod, 2);
    bitset_container_copy(B1, B1mod);
    bitset_container_add(B1mod, 2);

    int cx = array_container_cardinality(AX);  // expected xor

    container_t* C = NULL;

    assert_true(bitset_array_container_ixor(B2, A1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    // this case, result is inplace
    assert_ptr_equal(C, B2);

    C = NULL;
    assert_true(array_bitset_container_ixor(A2, B1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    assert_ptr_not_equal(C, A2);  // nb A2 is destroyed
    // don't test a case where result can fit in the array
    // until this is implemented...at that point, make sure

    bitset_container_free(CAST_bitset(C));
    C = NULL;
    // xoring something with itself, getting array
    assert_false(array_bitset_container_ixor(A1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;

    // B1mod and B1copy differ in position 2 only
    assert_false(bitset_bitset_container_ixor(B1mod, B1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;
    assert_false(array_array_container_ixor(A1mod, A1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    // array_container_free(A1); // disposed already
    //    array_container_free(A2); // has been disposed already
    array_container_free(AX);
    array_container_free(A1copy);

    bitset_container_free(B1);
    bitset_container_free(B1copy);
    bitset_container_free(B2);
    bitset_container_free(BX);
    array_container_free(CAST_array(C));
}